

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astc_codec.cpp
# Opt level: O3

ktx_error_code_e ktxTexture2_CompressAstc(ktxTexture2 *This,ktx_uint32_t quality)

{
  ktx_error_code_e kVar1;
  ktxAstcParams params;
  ktxAstcParams local_20;
  
  local_20.verbose = false;
  local_20._5_3_ = 0;
  local_20.qualityLevel = 0;
  local_20.normalMap = false;
  local_20.perceptual = false;
  local_20.inputSwizzle[0] = '\0';
  local_20.inputSwizzle[1] = '\0';
  local_20.inputSwizzle[2] = '\0';
  local_20.inputSwizzle[3] = '\0';
  local_20._30_2_ = 0;
  local_20.structSize = 0x20;
  local_20.threadCount = 1;
  local_20.blockDimension = 4;
  local_20.mode = 1;
  if (((9 < quality) && (local_20.qualityLevel = 10, 0x3b < quality)) &&
     (local_20.qualityLevel = 0x3c, 0x61 < quality)) {
    local_20.qualityLevel = (uint)(99 < quality) * 2 + 0x62;
  }
  kVar1 = ktxTexture2_CompressAstcEx(This,&local_20);
  return kVar1;
}

Assistant:

KTX_error_code
ktxTexture2_CompressAstc(ktxTexture2* This, ktx_uint32_t quality) {
    ktxAstcParams params = astcDefaultOptions();

    if (quality >= KTX_PACK_ASTC_QUALITY_LEVEL_FASTEST)
        params.qualityLevel = KTX_PACK_ASTC_QUALITY_LEVEL_FASTEST;

    if (quality >= KTX_PACK_ASTC_QUALITY_LEVEL_FAST)
        params.qualityLevel = KTX_PACK_ASTC_QUALITY_LEVEL_FAST;

    if (quality >= KTX_PACK_ASTC_QUALITY_LEVEL_MEDIUM)
        params.qualityLevel = KTX_PACK_ASTC_QUALITY_LEVEL_MEDIUM;

    if (quality >= KTX_PACK_ASTC_QUALITY_LEVEL_THOROUGH)
        params.qualityLevel = KTX_PACK_ASTC_QUALITY_LEVEL_THOROUGH;

    if (quality >= KTX_PACK_ASTC_QUALITY_LEVEL_EXHAUSTIVE)
        params.qualityLevel = KTX_PACK_ASTC_QUALITY_LEVEL_EXHAUSTIVE;

    return ktxTexture2_CompressAstcEx(This, &params);
}